

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::bitmaskI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  uint uVar1;
  int64_t iVar2;
  Literal *this_00;
  size_t i;
  long lVar3;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  this_00 = (Literal *)local_60;
  getLanesI64x2((LaneArray<2> *)this_00,this);
  uVar1 = 0;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    iVar2 = geti64(this_00);
    uVar1 = (uint)(iVar2 >> 0x3f) & 1 << ((byte)lVar3 & 0x1f) | uVar1;
    this_00 = this_00 + 1;
  }
  (__return_storage_ptr__->field_0).i32 = uVar1;
  (__return_storage_ptr__->type).id = 2;
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI64x2() const {
  uint32_t result = 0;
  LaneArray<2> lanes = getLanesI64x2();
  for (size_t i = 0; i < 2; ++i) {
    if (lanes[i].geti64() & (1ll << 63)) {
      result = result | (1 << i);
    }
  }
  return Literal(result);
}